

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O3

bool __thiscall
spvc_resources_s::copy_resources
          (spvc_resources_s *this,SmallVector<spvc_reflected_resource,_8UL> *outputs,
          SmallVector<spirv_cross::Resource,_8UL> *inputs)

{
  undefined8 uVar1;
  spvc_variable_id sVar2;
  size_t sVar3;
  Resource *pRVar4;
  spvc_reflected_resource *psVar5;
  char *pcVar6;
  bool bVar7;
  long lVar8;
  string *name;
  undefined4 local_48;
  undefined4 uStack_44;
  
  sVar3 = (inputs->super_VectorView<spirv_cross::Resource>).buffer_size;
  if (sVar3 == 0) {
    bVar7 = true;
  }
  else {
    pRVar4 = (inputs->super_VectorView<spirv_cross::Resource>).ptr;
    lVar8 = sVar3 * 0x30;
    do {
      name = &pRVar4->name;
      uVar1 = *(undefined8 *)((long)(name + -1) + 0x14);
      sVar2 = *(spvc_variable_id *)((long)(name + -1) + 0x10);
      pcVar6 = spvc_context_s::allocate_name(this->context,name);
      bVar7 = pcVar6 != (char *)0x0;
      if (pcVar6 == (char *)0x0) {
        return bVar7;
      }
      spirv_cross::SmallVector<spvc_reflected_resource,_8UL>::reserve
                (outputs,(outputs->super_VectorView<spvc_reflected_resource>).buffer_size + 1);
      psVar5 = (outputs->super_VectorView<spvc_reflected_resource>).ptr;
      sVar3 = (outputs->super_VectorView<spvc_reflected_resource>).buffer_size;
      psVar5[sVar3].id = sVar2;
      local_48 = (undefined4)uVar1;
      uStack_44 = (undefined4)((ulong)uVar1 >> 0x20);
      psVar5[sVar3].base_type_id = uStack_44;
      psVar5[sVar3].type_id = local_48;
      psVar5[sVar3].name = pcVar6;
      (outputs->super_VectorView<spvc_reflected_resource>).buffer_size = sVar3 + 1;
      pRVar4 = (Resource *)(name + 1);
      lVar8 = lVar8 + -0x30;
    } while (lVar8 != 0);
  }
  return bVar7;
}

Assistant:

bool spvc_resources_s::copy_resources(SmallVector<spvc_reflected_resource> &outputs,
                                      const SmallVector<Resource> &inputs)
{
	for (auto &i : inputs)
	{
		spvc_reflected_resource r;
		r.base_type_id = i.base_type_id;
		r.type_id = i.type_id;
		r.id = i.id;
		r.name = context->allocate_name(i.name);
		if (!r.name)
			return false;

		outputs.push_back(r);
	}

	return true;
}